

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O3

Scalar __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::_max_Z
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,RowVectorType *v)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char *__function;
  float fVar10;
  float fVar11;
  
  lVar1 = this->_Np;
  if ((lVar1 < 0) ||
     (uVar2 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows, (long)uVar2 <= lVar1)) {
LAB_0016c56b:
    __function = 
    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<long, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<long, -1, 1>, Level = 0]"
    ;
  }
  else {
    plVar3 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    lVar4 = plVar3[lVar1];
    if ((-1 < lVar4) &&
       (uVar5 = (v->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
       lVar4 < (long)uVar5)) {
      pfVar6 = (v->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      fVar10 = pfVar6[lVar4];
      uVar7 = (this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
      uVar9 = lVar1 + 1;
      fVar11 = fVar10;
      if ((long)uVar9 < (long)uVar7) {
        do {
          if (uVar2 <= uVar9) goto LAB_0016c56b;
          uVar8 = plVar3[uVar9];
          if (((long)uVar8 < 0) || (uVar5 <= uVar8)) goto LAB_0016c582;
          fVar10 = pfVar6[uVar8];
          if (fVar10 <= fVar11) {
            fVar10 = fVar11;
          }
          uVar9 = uVar9 + 1;
          fVar11 = fVar10;
        } while (uVar7 != uVar9);
      }
      return fVar10;
    }
LAB_0016c582:
    __function = 
    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<float, -1, 1>, Level = 0]"
    ;
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0xb5,__function);
}

Assistant:

Scalar _max_Z(const RowVectorType &v) {
    const IndicesType &idxs = _P.indices();
    Scalar m = v(idxs(_Np));
    for (Index i=(_Np+1); i<_A.cols(); i++) {
      Index idx = idxs(i);
      if (m < v(idx)) { m = v(idx);}
    }
    return m;
  }